

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_group.c
# Opt level: O1

ucs4_t ** dictionary_group_match_longest
                    (dictionary_group_t t_dictionary,ucs4_t *word,size_t maxlen,size_t *match_length
                    )

{
  ucs4_t **ppuVar1;
  ucs4_t **ppuVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ucs4_t **ppuVar6;
  size_t t_match_length;
  ulong local_38;
  
  if (*t_dictionary == 0) {
    errnum = DICTIONARY_ERROR_NODICT;
    ppuVar6 = (ucs4_t **)0xffffffffffffffff;
  }
  else {
    if (*t_dictionary == 0) {
      ppuVar6 = (ucs4_t **)0x0;
      uVar4 = 0;
    }
    else {
      uVar5 = 0;
      uVar4 = 0;
      ppuVar6 = (ucs4_t **)0x0;
      do {
        ppuVar2 = dictionary_match_longest
                            (*(dictionary_t *)((long)t_dictionary + uVar5 * 8 + 8),word,maxlen,
                             &local_38);
        uVar3 = local_38;
        ppuVar1 = ppuVar2;
        if (local_38 <= uVar4) {
          uVar3 = uVar4;
          ppuVar1 = ppuVar6;
        }
        if (ppuVar2 != (ucs4_t **)0x0) {
          uVar4 = uVar3;
          ppuVar6 = ppuVar1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < *t_dictionary);
    }
    if (match_length != (size_t *)0x0) {
      *match_length = uVar4;
    }
  }
  return ppuVar6;
}

Assistant:

const ucs4_t * const * dictionary_group_match_longest(dictionary_group_t t_dictionary, const ucs4_t * word,
		size_t maxlen, size_t * match_length)
{
	dictionary_group_desc * dictionary_group = (dictionary_group_desc *) t_dictionary;

	if (dictionary_group->count == 0)
	{
		errnum = DICTIONARY_ERROR_NODICT;
		return (const ucs4_t * const *) -1;
	}

	const ucs4_t * const * retval = NULL;
	size_t t_match_length, max_length = 0;

	size_t i;
	for (i = 0; i < dictionary_group->count; i ++)
	{
		/* 依次查找每個辭典，取得最長匹配長度 */
		const ucs4_t * const * t_retval = dictionary_match_longest(
				dictionary_group->dicts[i],
				word,
				maxlen,
				&t_match_length
		);

		if (t_retval != NULL)
		{
			if (t_match_length > max_length)
			{
				max_length = t_match_length;
				retval = t_retval;
			}
		}
	}

	if (match_length != NULL)
	{
		*match_length = max_length;
	}

	return retval;
}